

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatActivity.c
# Opt level: O2

void Msat_SolverClaRescaleActivity(Msat_Solver_t *p)

{
  uint uVar1;
  Msat_Clause_t **ppMVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  uVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar2 = Msat_ClauseVecReadArray(p->vLearned);
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    fVar5 = Msat_ClauseReadActivity(ppMVar2[uVar3]);
    Msat_ClauseWriteActivity(ppMVar2[uVar3],fVar5 * 1e-20);
  }
  p->dClaInc = p->dClaInc * 1e-20;
  return;
}

Assistant:

void Msat_SolverClaRescaleActivity( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;
    float Activ;
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        Activ = Msat_ClauseReadActivity( pLearned[i] );
        Msat_ClauseWriteActivity( pLearned[i], Activ * (float)1e-20 );
    }
    p->dClaInc *= 1e-20;
}